

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateBlockingStub
          (ImmutableServiceGenerator *this,Printer *printer)

{
  ServiceDescriptor *pSVar1;
  mapped_type *pmVar2;
  int i_00;
  MethodDescriptor *method;
  ulong uVar3;
  long lVar4;
  int i;
  long lVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  allocator<char> local_b1;
  ulong local_b0;
  long local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  string local_70;
  key_type local_50;
  
  io::Printer::Print(printer,
                     "public static BlockingInterface newBlockingStub(\n    com.google.protobuf.BlockingRpcChannel channel) {\n  return new BlockingStub(channel);\n}\n\n"
                    );
  io::Printer::Print(printer,"public interface BlockingInterface {");
  io::Printer::Indent(printer);
  lVar4 = 0;
  for (lVar5 = 0; pSVar1 = (this->super_ServiceGenerator).descriptor_,
      lVar5 < *(int *)(pSVar1 + 0x20); lVar5 = lVar5 + 1) {
    GenerateBlockingMethodSignature
              (this,printer,(MethodDescriptor *)(*(long *)(pSVar1 + 0x28) + lVar4));
    io::Printer::Print(printer,";\n");
    lVar4 = lVar4 + 0x68;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "private static final class BlockingStub implements BlockingInterface {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n  this.channel = channel;\n}\n\nprivate final com.google.protobuf.BlockingRpcChannel channel;\n"
                    );
  lVar4 = 0;
  uVar3 = 0;
  while (pSVar1 = (this->super_ServiceGenerator).descriptor_,
        (long)uVar3 < (long)*(int *)(pSVar1 + 0x20)) {
    method = (MethodDescriptor *)(*(long *)(pSVar1 + 0x28) + lVar4);
    local_a8 = lVar4;
    GenerateBlockingMethodSignature(this,printer,method);
    io::Printer::Print(printer," {\n");
    io::Printer::Indent(printer);
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0._M_impl.super__Rb_tree_header._M_header;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b0 = uVar3;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
    SimpleItoa_abi_cxx11_(&local_70,(protobuf *)(uVar3 & 0xffffffff),i_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"index",&local_b1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_a0,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    GetOutput_abi_cxx11_(&local_70,this,method);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"output",&local_b1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_a0,&local_50);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_a0,
                       "return ($output$) channel.callBlockingMethod(\n  getDescriptor().getMethods().get($index$),\n  controller,\n  request,\n  $output$.getDefaultInstance());\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_a0);
    lVar4 = local_a8 + 0x68;
    uVar3 = local_b0 + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateBlockingStub(io::Printer* printer) {
  printer->Print(
    "public static BlockingInterface newBlockingStub(\n"
    "    com.google.protobuf.BlockingRpcChannel channel) {\n"
    "  return new BlockingStub(channel);\n"
    "}\n"
    "\n");

  printer->Print(
    "public interface BlockingInterface {");
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(";\n");
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "private static final class BlockingStub implements BlockingInterface {\n");
  printer->Indent();

  printer->Print(
    "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n"
    "  this.channel = channel;\n"
    "}\n"
    "\n"
    "private final com.google.protobuf.BlockingRpcChannel channel;\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(" {\n");
    printer->Indent();

    std::map<string, string> vars;
    vars["index"] = SimpleItoa(i);
    vars["output"] = GetOutput(method);
    printer->Print(vars,
      "return ($output$) channel.callBlockingMethod(\n"
      "  getDescriptor().getMethods().get($index$),\n"
      "  controller,\n"
      "  request,\n"
      "  $output$.getDefaultInstance());\n");

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}